

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWritePla.c
# Opt level: O1

int Io_WriteMoPlaOne(FILE *pFile,Abc_Ntk_t *pNtk)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  DdManager *dd;
  Vec_Ptr_t *vFuncs;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  void *pvVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWritePla.c"
                  ,0x188,"int Io_WriteMoPlaOne(FILE *, Abc_Ntk_t *)");
  }
  iVar9 = 0;
  dd = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,10000000,1,1,0,0);
  if (dd != (DdManager *)0x0) {
    iVar9 = pNtk->vCos->nSize;
    vFuncs = (Vec_Ptr_t *)malloc(0x10);
    iVar8 = 8;
    if (6 < iVar9 - 1U) {
      iVar8 = iVar9;
    }
    vFuncs->nSize = 0;
    vFuncs->nCap = iVar8;
    if (iVar8 == 0) {
      ppvVar4 = (void **)0x0;
    }
    else {
      ppvVar4 = (void **)malloc((long)iVar8 << 3);
    }
    vFuncs->pArray = ppvVar4;
    pVVar5 = pNtk->vCos;
    if (0 < pVVar5->nSize) {
      lVar11 = 0;
      do {
        lVar10 = *(long *)(*pVVar5->pArray[lVar11] + 0x1b0);
        if (*(int *)(lVar10 + 4) < 8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        piVar3 = *(int **)(*(long *)(lVar10 + 8) + 0x38);
        if (*(void **)(piVar3 + 2) == (void *)0x0) {
          __assert_fail("p->pArrayPtr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecAtt.h"
                        ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
        }
        iVar9 = (int)*(long *)((long)pVVar5->pArray[lVar11] + 0x10);
        lVar10 = (long)iVar9;
        iVar8 = *piVar3;
        if (iVar8 <= iVar9) {
          iVar12 = iVar9 + 10;
          if (iVar9 < iVar8 * 2) {
            iVar12 = iVar8 * 2;
          }
          if (iVar8 < iVar12) {
            pvVar6 = realloc(*(void **)(piVar3 + 2),(long)iVar12 * 8);
            *(void **)(piVar3 + 2) = pvVar6;
            memset((void *)((long)pvVar6 + (long)*piVar3 * 8),0,((long)iVar12 - (long)*piVar3) * 8);
            *piVar3 = iVar12;
          }
        }
        if ((*(long *)(*(long *)(piVar3 + 2) + lVar10 * 8) == 0) &&
           (*(code **)(piVar3 + 8) != (code *)0x0)) {
          uVar7 = (**(code **)(piVar3 + 8))(*(undefined8 *)(piVar3 + 4));
          *(undefined8 *)(*(long *)(piVar3 + 2) + lVar10 * 8) = uVar7;
        }
        pvVar6 = *(void **)(*(long *)(piVar3 + 2) + lVar10 * 8);
        uVar1 = vFuncs->nSize;
        uVar2 = vFuncs->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (vFuncs->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(vFuncs->pArray,0x80);
            }
            iVar9 = 0x10;
          }
          else {
            iVar9 = uVar2 * 2;
            if (iVar9 <= (int)uVar2) goto LAB_00345c8a;
            if (vFuncs->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(vFuncs->pArray,(ulong)uVar2 << 4);
            }
          }
          vFuncs->pArray = ppvVar4;
          vFuncs->nCap = iVar9;
        }
LAB_00345c8a:
        vFuncs->nSize = uVar1 + 1;
        vFuncs->pArray[(int)uVar1] = pvVar6;
        lVar11 = lVar11 + 1;
        pVVar5 = pNtk->vCos;
      } while (lVar11 < pVVar5->nSize);
    }
    Io_WriteMoPlaOneIntMinterms(pFile,pNtk,dd,vFuncs);
    Abc_NtkFreeGlobalBdds(pNtk,0);
    iVar9 = vFuncs->nSize;
    if (0 < (long)iVar9) {
      ppvVar4 = vFuncs->pArray;
      lVar11 = 0;
      do {
        Cudd_RecursiveDeref(dd,(DdNode *)ppvVar4[lVar11]);
        lVar11 = lVar11 + 1;
      } while (iVar9 != lVar11);
    }
    if (vFuncs->pArray != (void **)0x0) {
      free(vFuncs->pArray);
      vFuncs->pArray = (void **)0x0;
    }
    free(vFuncs);
    Extra_StopManager(dd);
    iVar9 = 1;
  }
  return iVar9;
}

Assistant:

int Io_WriteMoPlaOne( FILE * pFile, Abc_Ntk_t * pNtk )
{
    int fVerbose = 0;
    DdManager * dd;
    DdNode * bFunc;
    Vec_Ptr_t * vFuncsGlob;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, 10000000, 1, 1, 0, fVerbose );
    if ( dd == NULL )
        return 0;
    if ( fVerbose )
        printf( "Shared BDD size = %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );

    // complement the global functions
    vFuncsGlob = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_PtrPush( vFuncsGlob, Abc_ObjGlobalBdd(pObj) );

    // consider minterms
    Io_WriteMoPlaOneIntMinterms( pFile, pNtk, dd, vFuncsGlob );
    Abc_NtkFreeGlobalBdds( pNtk, 0 );

    // cleanup
    Vec_PtrForEachEntry( DdNode *, vFuncsGlob, bFunc, i )
        Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrFree( vFuncsGlob );
    Extra_StopManager( dd );
    return 1;
}